

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O3

size_t __thiscall adios2::transport::FileRemote::GetSize(FileRemote *this)

{
  if ((this->super_Transport).m_OpenMode == Read) {
    return this->m_Size;
  }
  return 0;
}

Assistant:

size_t FileRemote::GetSize()
{
    WaitForOpen();
    switch (m_OpenMode)
    {
    case Mode::Write:
    case Mode::Append:
        return 0;
    case Mode::Read:
        return m_Size;
    default:
        return 0;
    }
}